

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O3

void __thiscall MT32Emu::PartialManager::partialDeactivated(PartialManager *this,int partialIndex)

{
  Synth *this_00;
  Partial *this_01;
  bool bVar1;
  Bit32u BVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = this->inactivePartialCount;
  BVar2 = Synth::getPartialCount(this->synth);
  if (uVar3 < BVar2) {
    uVar3 = this->inactivePartialCount;
    this->inactivePartialCount = uVar3 + 1;
    this->inactivePartials[uVar3] = partialIndex;
  }
  else {
    Synth::printDebug(this->synth,
                      "PartialManager Error: Cannot return deactivated partial %d, current partial state:\n"
                      ,partialIndex);
    BVar2 = Synth::getPartialCount(this->synth);
    if (BVar2 != 0) {
      uVar4 = 0;
      do {
        this_00 = this->synth;
        this_01 = this->partialTable[uVar4];
        bVar1 = Partial::isActive(this_01);
        uVar3 = Partial::getOwnerPart(this_01);
        Synth::printDebug(this_00,"[Partial %d]: activation=%d, owner part=%d\n",uVar4 & 0xffffffff,
                          (ulong)bVar1,(ulong)uVar3);
        uVar4 = uVar4 + 1;
        BVar2 = Synth::getPartialCount(this->synth);
      } while (uVar4 < BVar2);
    }
  }
  return;
}

Assistant:

void PartialManager::partialDeactivated(int partialIndex) {
	if (inactivePartialCount < synth->getPartialCount()) {
		inactivePartials[inactivePartialCount++] = partialIndex;
		return;
	}
	synth->printDebug("PartialManager Error: Cannot return deactivated partial %d, current partial state:\n", partialIndex);
	for (Bit32u i = 0; i < synth->getPartialCount(); i++) {
		const Partial *partial = partialTable[i];
		synth->printDebug("[Partial %d]: activation=%d, owner part=%d\n", i, partial->isActive(), partial->getOwnerPart());
	}
}